

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c++
# Opt level: O1

void __thiscall
kj::DestructorOnlyArrayDisposer::disposeImpl
          (DestructorOnlyArrayDisposer *this,void *firstElement,size_t elementSize,
          size_t elementCount,size_t capacity,_func_void_void_ptr *destroyElement)

{
  void *pvVar1;
  
  if (elementCount != 0 && destroyElement != (_func_void_void_ptr *)0x0) {
    pvVar1 = (void *)((elementCount - 1) * elementSize + (long)firstElement);
    do {
      (*destroyElement)(pvVar1);
      elementCount = elementCount - 1;
      pvVar1 = (void *)((long)pvVar1 - elementSize);
    } while (elementCount != 0);
  }
  return;
}

Assistant:

void DestructorOnlyArrayDisposer::disposeImpl(
    void* firstElement, size_t elementSize, size_t elementCount,
    size_t capacity, void (*destroyElement)(void*)) const {
  if (destroyElement != nullptr) {
    ExceptionSafeArrayUtil guard(firstElement, elementSize, elementCount, destroyElement);
    guard.destroyAll();
  }
}